

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O1

unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true> __thiscall
duckdb::StringUtil::ParseJSONMap(StringUtil *this,string *json,bool ignore_errors)

{
  _func_void_void_ptr_void_ptr *p_Var1;
  void *pvVar2;
  ulong uVar3;
  ulong uVar4;
  pointer pcVar5;
  bool bVar6;
  ComplexJSON *pCVar7;
  yyjson_doc *pyVar8;
  uint64_t uVar9;
  undefined8 uVar10;
  pointer pCVar11;
  char *pcVar12;
  SerializationException *pSVar13;
  char *pcVar14;
  yyjson_val *pyVar15;
  yyjson_val *pyVar16;
  unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true> nested_result;
  size_t json_str_len;
  string local_138;
  _Tuple_impl<0UL,_duckdb::ComplexJSON_*,_std::default_delete<duckdb::ComplexJSON>_> local_118;
  yyjson_val *local_110;
  undefined8 local_108;
  string *local_100;
  ulong local_f8;
  yyjson_alc *local_f0;
  yyjson_val_uni local_e8;
  yyjson_val *local_e0;
  undefined8 local_d8;
  ComplexJSON *local_d0;
  string local_c8;
  yyjson_doc *local_a8;
  yyjson_val *local_a0;
  ulong local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pCVar7 = (ComplexJSON *)operator_new(0x60);
  ComplexJSON::ComplexJSON(pCVar7,json);
  *(ComplexJSON **)this = pCVar7;
  if (json->_M_string_length != 0) {
    local_118.super__Head_base<0UL,_duckdb::ComplexJSON_*,_false>._M_head_impl =
         (_Head_base<0UL,_duckdb::ComplexJSON_*,_false>)
         (_Head_base<0UL,_duckdb::ComplexJSON_*,_false>)this;
    pyVar8 = duckdb_yyjson::yyjson_read_opts
                       ((json->_M_dataplus)._M_p,json->_M_string_length,0x40,(yyjson_alc *)0x0,
                        (yyjson_read_err *)0x0);
    local_100 = json;
    if (pyVar8 == (yyjson_doc *)0x0) {
      if (!ignore_errors) {
        pSVar13 = (SerializationException *)__cxa_allocate_exception(0x10);
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_138,"Failed to parse JSON string: %s","");
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        pcVar5 = (local_100->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar5,pcVar5 + local_100->_M_string_length);
        SerializationException::SerializationException<std::__cxx11::string>
                  (pSVar13,&local_138,&local_50);
        __cxa_throw(pSVar13,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      pyVar15 = pyVar8->root;
      if ((pyVar15 == (yyjson_val *)0x0) || ((~(uint)pyVar15->tag & 7) != 0)) {
        p_Var1 = (pyVar8->alc).free;
        pvVar2 = (pyVar8->alc).ctx;
        (pyVar8->alc).malloc = (_func_void_ptr_void_ptr_size_t *)0x0;
        (pyVar8->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x0;
        (pyVar8->alc).free = (_func_void_void_ptr_void_ptr *)0x0;
        (pyVar8->alc).ctx = (void *)0x0;
        if (pyVar8->str_pool != (char *)0x0) {
          (*p_Var1)(pvVar2,pyVar8->str_pool);
        }
        (*p_Var1)(pvVar2,pyVar8);
        if (!ignore_errors) {
          pSVar13 = (SerializationException *)__cxa_allocate_exception(0x10);
          local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_138,"Failed to parse JSON string: %s","");
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          pcVar5 = (local_100->_M_dataplus)._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_70,pcVar5,pcVar5 + local_100->_M_string_length);
          SerializationException::SerializationException<std::__cxx11::string>
                    (pSVar13,&local_138,&local_70);
          __cxa_throw(pSVar13,&SerializationException::typeinfo,::std::runtime_error::~runtime_error
                     );
        }
      }
      else {
        local_98 = (ulong)((uint)pyVar15->tag & 7);
        local_a0 = (yyjson_val *)(pyVar15->tag >> 8);
        pyVar16 = (yyjson_val *)0x0;
        local_110 = pyVar15 + 1;
        if (local_98 != 7) {
          local_110 = pyVar16;
        }
        local_f0 = &pyVar8->alc;
        local_f8 = 0;
        local_a8 = pyVar8;
        do {
          if (((int)local_98 == 7) && (pyVar16 < local_a0)) {
            uVar9 = 0x10;
            if ((~(uint)local_110[1].tag & 6) == 0) {
              uVar9 = local_110[1].uni.u64;
            }
            pyVar16 = (yyjson_val *)((long)&pyVar16->tag + 1);
            pyVar15 = local_110;
            local_110 = (yyjson_val *)((long)&local_110[1].tag + uVar9);
          }
          else {
            pyVar15 = (yyjson_val *)0x0;
          }
          if (pyVar15 == (yyjson_val *)0x0) {
            p_Var1 = (pyVar8->alc).free;
            pvVar2 = (pyVar8->alc).ctx;
            (pyVar8->alc).malloc = (_func_void_ptr_void_ptr_size_t *)0x0;
            (pyVar8->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x0;
            (pyVar8->alc).free = (_func_void_void_ptr_void_ptr *)0x0;
            (pyVar8->alc).ctx = (void *)0x0;
            if (pyVar8->str_pool != (char *)0x0) {
              (*p_Var1)(pvVar2,pyVar8->str_pool);
            }
            (*p_Var1)(pvVar2,pyVar8);
            return (unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>)
                   (_Tuple_impl<0UL,_duckdb::ComplexJSON_*,_std::default_delete<duckdb::ComplexJSON>_>
                    )this;
          }
          if ((~(byte)pyVar15[1].tag & 7) == 0) {
            if ((pyVar15->tag & 7) == 5) {
              local_e8 = pyVar15->uni;
            }
            else {
              local_e8.u64 = 0;
            }
            uVar3 = pyVar15->tag;
            local_e0 = pyVar16;
            pcVar12 = duckdb_yyjson::yyjson_val_write_opts
                                (pyVar15 + 1,0,(yyjson_alc *)0x0,(usize *)&local_c8,
                                 (yyjson_write_err *)0x0);
            bVar6 = pcVar12 != (char *)0x0;
            if (pcVar12 == (char *)0x0) {
              p_Var1 = (pyVar8->alc).free;
              pvVar2 = (pyVar8->alc).ctx;
              local_f0->free = (_func_void_void_ptr_void_ptr *)0x0;
              local_f0->ctx = (void *)0x0;
              local_f0->malloc = (_func_void_ptr_void_ptr_size_t *)0x0;
              local_f0->realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x0;
              if (pyVar8->str_pool != (char *)0x0) {
                (*p_Var1)(pvVar2,pyVar8->str_pool);
              }
              uVar10 = (*p_Var1)(pvVar2,pyVar8);
              local_f8 = CONCAT71((int7)((ulong)uVar10 >> 8),1);
              pyVar16 = local_e0;
              if (!ignore_errors) {
                pSVar13 = (SerializationException *)__cxa_allocate_exception(0x10);
                local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_138,"Failed to stringify nested JSON object","");
                SerializationException::SerializationException(pSVar13,&local_138);
                __cxa_throw(pSVar13,&SerializationException::typeinfo,
                            ::std::runtime_error::~runtime_error);
              }
            }
            else {
              local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_138,pcVar12,local_c8._M_dataplus._M_p + (long)pcVar12);
              ParseJSONMap((StringUtil *)&local_108,&local_138,ignore_errors);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_138._M_dataplus._M_p != &local_138.field_2) {
                operator_delete(local_138._M_dataplus._M_p);
              }
              pCVar11 = unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true>
                        ::operator->((unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true>
                                      *)this);
              local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_138,local_e8.u64,local_e8.str + (uVar3 >> 8));
              local_d8 = local_108;
              local_108 = 0;
              ComplexJSON::AddObject
                        (pCVar11,&local_138,
                         (unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true>
                          *)&local_d8);
              pyVar16 = local_e0;
              std::unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>::
              ~unique_ptr((unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>
                           *)&local_d8);
              this = (StringUtil *)local_118;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_138._M_dataplus._M_p != &local_138.field_2) {
                operator_delete(local_138._M_dataplus._M_p);
              }
              free(pcVar12);
              std::unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>::
              ~unique_ptr((unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>
                           *)&local_108);
            }
          }
          else if (((uint)pyVar15[1].tag & 7) == 5) {
            if ((pyVar15->tag & 7) == 5) {
              pcVar12 = (pyVar15->uni).str;
            }
            else {
              pcVar12 = (char *)0x0;
            }
            uVar3 = pyVar15[1].tag;
            if (((uint)uVar3 & 7) == 5) {
              pcVar14 = pyVar15[1].uni.str;
            }
            else {
              pcVar14 = (char *)0x0;
            }
            uVar4 = pyVar15->tag;
            pCVar11 = unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true>
                      ::operator->((unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true>
                                    *)local_118.super__Head_base<0UL,_duckdb::ComplexJSON_*,_false>.
                                      _M_head_impl);
            local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_138,pcVar12,pcVar12 + (uVar4 >> 8));
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_c8,pcVar14,pcVar14 + (uVar3 >> 8));
            this = (StringUtil *)
                   local_118.super__Head_base<0UL,_duckdb::ComplexJSON_*,_false>._M_head_impl;
            pCVar7 = (ComplexJSON *)operator_new(0x60);
            pyVar8 = local_a8;
            ComplexJSON::ComplexJSON(pCVar7,&local_c8);
            local_d0 = pCVar7;
            ComplexJSON::AddObject
                      (pCVar11,&local_138,
                       (unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true>
                        *)&local_d0);
            std::unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>::
            ~unique_ptr((unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>
                         *)&local_d0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != &local_138.field_2) {
              operator_delete(local_138._M_dataplus._M_p);
            }
            bVar6 = true;
          }
          else {
            p_Var1 = (pyVar8->alc).free;
            pvVar2 = (pyVar8->alc).ctx;
            local_f0->free = (_func_void_void_ptr_void_ptr *)0x0;
            local_f0->ctx = (void *)0x0;
            local_f0->malloc = (_func_void_ptr_void_ptr_size_t *)0x0;
            local_f0->realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x0;
            if (pyVar8->str_pool != (char *)0x0) {
              (*p_Var1)(pvVar2,pyVar8->str_pool);
            }
            uVar10 = (*p_Var1)(pvVar2,pyVar8);
            if (!ignore_errors) {
              pSVar13 = (SerializationException *)__cxa_allocate_exception(0x10);
              local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_138,"Failed to parse JSON string: %s","");
              local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
              pcVar5 = (local_100->_M_dataplus)._M_p;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_90,pcVar5,pcVar5 + local_100->_M_string_length);
              SerializationException::SerializationException<std::__cxx11::string>
                        (pSVar13,&local_138,&local_90);
              __cxa_throw(pSVar13,&SerializationException::typeinfo,
                          ::std::runtime_error::~runtime_error);
            }
            local_f8 = CONCAT71((int7)((ulong)uVar10 >> 8),1);
            bVar6 = false;
          }
        } while (bVar6);
        if ((local_f8 & 1) == 0) {
          std::unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>::
          ~unique_ptr((unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_> *)
                      this);
        }
      }
    }
  }
  return (unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>)
         (__uniq_ptr_impl<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>)this;
}

Assistant:

unique_ptr<ComplexJSON> StringUtil::ParseJSONMap(const string &json, bool ignore_errors) {
	auto result = make_uniq<ComplexJSON>(json);
	if (json.empty()) {
		return result;
	}
	yyjson_read_flag flags = YYJSON_READ_ALLOW_INVALID_UNICODE;
	yyjson_doc *doc = yyjson_read(json.c_str(), json.size(), flags);
	if (!doc) {
		if (ignore_errors) {
			return result;
		}
		throw SerializationException("Failed to parse JSON string: %s", json);
	}
	yyjson_val *root = yyjson_doc_get_root(doc);
	if (!root || yyjson_get_type(root) != YYJSON_TYPE_OBJ) {
		yyjson_doc_free(doc);
		if (ignore_errors) {
			return result;
		}
		throw SerializationException("Failed to parse JSON string: %s", json);
	}
	yyjson_obj_iter iter;
	yyjson_obj_iter_init(root, &iter);
	yyjson_val *key, *value;
	while ((key = yyjson_obj_iter_next(&iter))) {
		value = yyjson_obj_iter_get_val(key);
		auto type = yyjson_get_type(value);
		if (type == YYJSON_TYPE_STR) {
			// Since this is a string, we can directly add the value
			const auto key_val = yyjson_get_str(key);
			const auto key_len = yyjson_get_len(key);
			const auto value_val = yyjson_get_str(value);
			const auto value_len = yyjson_get_len(value);
			result->AddObject(string(key_val, key_len), make_uniq<ComplexJSON>(string(value_val, value_len)));
		} else if (type == YYJSON_TYPE_OBJ) {
			// We recurse, this is a complex json
			const auto key_val = yyjson_get_str(key);
			const auto key_len = yyjson_get_len(key);
			// Convert the object value to a JSON string and recurse
			size_t json_str_len;
			char *json_str = yyjson_val_write(value, 0, &json_str_len);
			if (json_str) {
				auto nested_result = ParseJSONMap(string(json_str, json_str_len), ignore_errors);
				result->AddObject(string(key_val, key_len), std::move(nested_result));
				free(json_str); // Clean up the allocated string
			} else {
				yyjson_doc_free(doc);
				if (ignore_errors) {
					return result;
				}
				throw SerializationException("Failed to stringify nested JSON object");
			}
		} else {
			// Anything else is invalid.
			yyjson_doc_free(doc);
			if (ignore_errors) {
				return result;
			}
			throw SerializationException("Failed to parse JSON string: %s", json);
		}
	}
	yyjson_doc_free(doc);
	return result;
}